

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O0

void __thiscall benchmark::State::SetIterationTime(State *this,double seconds)

{
  double in_RDI;
  CheckHandler *in_XMM0_Qa;
  TimerManager *unaff_retaddr;
  int in_stack_ffffffffffffffd4;
  char *in_stack_ffffffffffffffd8;
  uint7 in_stack_ffffffffffffffe0;
  byte bVar1;
  CheckHandler in_stack_ffffffffffffffe8;
  
  bVar1 = 0;
  if (((anonymous_namespace)::running_benchmark & 1) == 0) {
    internal::CheckHandler::CheckHandler
              (in_XMM0_Qa,(char *)in_stack_ffffffffffffffe8.log_,
               (char *)(ulong)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
               in_stack_ffffffffffffffd4);
    bVar1 = 1;
    internal::CheckHandler::GetLog((CheckHandler *)&stack0xffffffffffffffe8);
  }
  else {
    internal::GetNullLogInstance();
  }
  if ((bVar1 & 1) == 0) {
    std::
    unique_ptr<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
    ::operator->((unique_ptr<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                  *)0x168066);
    anon_unknown_1::TimerManager::SetIterationTime(unaff_retaddr,in_RDI);
    return;
  }
  internal::CheckHandler::~CheckHandler((CheckHandler *)&LAB_00168043);
}

Assistant:

void State::SetIterationTime(double seconds)
{
  CHECK(running_benchmark);
  timer_manager->SetIterationTime(seconds);
}